

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

void __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::MinimalityCheck(MinimalityCheck *this,FwdCheck *afwd)

{
  FwdCheck FVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  FVar1 = *afwd;
  this->fwd = FVar1;
  this->low = 0;
  this->next = 0;
  this->scc = 0;
  uVar3 = FVar1._0_4_;
  bVar5 = (uVar3 & 0x7f000000) < 0x64000001;
  uVar2 = uVar3 & 0x80ffffff | 0x64000000;
  if (bVar5) {
    uVar2 = uVar3;
  }
  uVar3 = uVar2 & 0xffffff;
  if (!bVar5 || uVar3 == 0) {
    uVar4 = uVar2 | 0xffffff;
    if (uVar3 != 0) {
      uVar4 = uVar2;
    }
    *(uint *)&this->fwd = uVar4;
  }
  uVar2 = 0xffffff;
  if (uVar3 != 0) {
    uVar2 = uVar3;
  }
  this->high = uVar2;
  return;
}

Assistant:

DefaultUnfoundedCheck::MinimalityCheck::MinimalityCheck(const FwdCheck& afwd) : fwd(afwd), high(UINT32_MAX), low(0), next(0), scc(0) {
	if (fwd.highPct > 100) { fwd.highPct  = 100; }
	if (fwd.highStep == 0) { fwd.highStep = ~fwd.highStep; }
	high = fwd.highStep;
}